

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueueBenchmark.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  int *piVar5;
  size_type sVar6;
  thread t;
  thread t_1;
  int cpu1;
  int val;
  SPSCQueue<int,_std::allocator<int>_> q2;
  SPSCQueue<int,_std::allocator<int>_> q;
  thread local_328;
  thread local_320;
  int local_314;
  undefined8 local_310;
  int local_304;
  SPSCQueue<int,_std::allocator<int>_> local_300;
  SPSCQueue<int,_std::allocator<int>_> local_1c0;
  
  local_314 = -1;
  if (argc == 3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,argv[1],(allocator<char> *)&local_300);
    local_314 = std::__cxx11::stoi((string *)&local_1c0,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,argv[2],(allocator<char> *)&local_300);
    iVar2 = std::__cxx11::stoi((string *)&local_1c0,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_1c0);
  }
  else {
    iVar2 = -1;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"SPSCQueue:");
  std::endl<char,std::char_traits<char>>(poVar4);
  rigtorp::SPSCQueue<int,_std::allocator<int>_>::SPSCQueue
            (&local_1c0,10000000,(allocator<int> *)&local_300);
  local_328._M_id._M_thread = (id)0;
  local_300.capacity_ = (size_t)operator_new(0x18);
  *(undefined ***)local_300.capacity_ = &PTR___State_00105cb0;
  *(int **)(local_300.capacity_ + 8) = &local_314;
  *(SPSCQueue<int,_std::allocator<int>_> **)(local_300.capacity_ + 0x10) = &local_1c0;
  std::thread::_M_start_thread(&local_328,&local_300,0);
  if ((long *)local_300.capacity_ != (long *)0x0) {
    (**(code **)(*(long *)local_300.capacity_ + 8))();
  }
  pinThread(iVar2);
  std::chrono::_V2::steady_clock::now();
  iVar3 = 0;
  while (local_300.capacity_ = CONCAT44(local_300.capacity_._4_4_,iVar3), iVar3 < 10000000) {
    rigtorp::SPSCQueue<int,std::allocator<int>>::emplace<int&>
              ((SPSCQueue<int,std::allocator<int>> *)&local_1c0,(int *)&local_300);
    iVar3 = (int)local_300.capacity_ + 1;
  }
  std::thread::join();
  std::chrono::_V2::steady_clock::now();
  poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
  poVar4 = std::operator<<(poVar4," ops/ms");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::thread::~thread(&local_328);
  rigtorp::SPSCQueue<int,_std::allocator<int>_>::~SPSCQueue(&local_1c0);
  rigtorp::SPSCQueue<int,_std::allocator<int>_>::SPSCQueue
            (&local_1c0,10000000,(allocator<int> *)&local_300);
  rigtorp::SPSCQueue<int,_std::allocator<int>_>::SPSCQueue
            (&local_300,10000000,(allocator<int> *)&local_328);
  local_320._M_id._M_thread = (id)0;
  local_328._M_id._M_thread = (id)operator_new(0x20);
  *(undefined ***)local_328._M_id._M_thread = &PTR___State_00105cf0;
  *(int **)((long)local_328._M_id._M_thread + 8) = &local_314;
  *(SPSCQueue<int,_std::allocator<int>_> **)((long)local_328._M_id._M_thread + 0x10) = &local_1c0;
  *(SPSCQueue<int,_std::allocator<int>_> **)((long)local_328._M_id._M_thread + 0x18) = &local_300;
  std::thread::_M_start_thread(&local_320,&local_328,0);
  if (local_328._M_id._M_thread != 0) {
    (**(code **)(*(long *)local_328._M_id._M_thread + 8))();
  }
  pinThread(iVar2);
  std::chrono::_V2::steady_clock::now();
  iVar3 = 0;
  while (local_328._M_id._M_thread._0_4_ = iVar3, iVar3 < 10000000) {
    rigtorp::SPSCQueue<int,std::allocator<int>>::emplace<int&>
              ((SPSCQueue<int,std::allocator<int>> *)&local_1c0,(int *)&local_328);
    do {
      piVar5 = rigtorp::SPSCQueue<int,_std::allocator<int>_>::front(&local_300);
    } while (piVar5 == (int *)0x0);
    rigtorp::SPSCQueue<int,_std::allocator<int>_>::pop(&local_300);
    iVar3 = (int)local_328._M_id._M_thread + 1;
  }
  std::chrono::_V2::steady_clock::now();
  std::thread::join();
  poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
  poVar4 = std::operator<<(poVar4," ns RTT");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::thread::~thread(&local_320);
  rigtorp::SPSCQueue<int,_std::allocator<int>_>::~SPSCQueue(&local_300);
  rigtorp::SPSCQueue<int,_std::allocator<int>_>::~SPSCQueue(&local_1c0);
  poVar4 = std::operator<<((ostream *)&std::cout,"boost::lockfree::spsc:");
  std::endl<char,std::char_traits<char>>(poVar4);
  boost::lockfree::detail::runtime_sized_ringbuffer<int,_std::allocator<int>_>::
  runtime_sized_ringbuffer
            ((runtime_sized_ringbuffer<int,_std::allocator<int>_> *)&local_1c0,10000000);
  local_328._M_id._M_thread = (id)0;
  local_300.capacity_ = (size_t)operator_new(0x18);
  *(undefined ***)local_300.capacity_ = &PTR___State_00105d30;
  *(int **)(local_300.capacity_ + 8) = &local_314;
  *(SPSCQueue<int,_std::allocator<int>_> **)(local_300.capacity_ + 0x10) = &local_1c0;
  std::thread::_M_start_thread(&local_328,&local_300,0);
  if ((long *)local_300.capacity_ != (long *)0x0) {
    (**(code **)(*(long *)local_300.capacity_ + 8))();
  }
  pinThread(iVar2);
  std::chrono::_V2::steady_clock::now();
  iVar3 = 0;
  while (local_300.capacity_ = CONCAT44(local_300.capacity_._4_4_,iVar3), iVar3 < 10000000) {
    do {
      bVar1 = boost::lockfree::detail::runtime_sized_ringbuffer<int,_std::allocator<int>_>::push
                        ((runtime_sized_ringbuffer<int,_std::allocator<int>_> *)&local_1c0,
                         (int *)&local_300);
    } while (!bVar1);
    iVar3 = (int)local_300.capacity_ + 1;
  }
  std::thread::join();
  std::chrono::_V2::steady_clock::now();
  poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
  poVar4 = std::operator<<(poVar4," ops/ms");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::thread::~thread(&local_328);
  boost::lockfree::detail::runtime_sized_ringbuffer<int,_std::allocator<int>_>::
  ~runtime_sized_ringbuffer((runtime_sized_ringbuffer<int,_std::allocator<int>_> *)&local_1c0);
  boost::lockfree::detail::runtime_sized_ringbuffer<int,_std::allocator<int>_>::
  runtime_sized_ringbuffer
            ((runtime_sized_ringbuffer<int,_std::allocator<int>_> *)&local_1c0,10000000);
  boost::lockfree::detail::runtime_sized_ringbuffer<int,_std::allocator<int>_>::
  runtime_sized_ringbuffer
            ((runtime_sized_ringbuffer<int,_std::allocator<int>_> *)&local_300,10000000);
  local_320._M_id._M_thread = (id)0;
  local_328._M_id._M_thread = (id)operator_new(0x20);
  *(undefined ***)local_328._M_id._M_thread = &PTR___State_00105d70;
  *(int **)((long)local_328._M_id._M_thread + 8) = &local_314;
  *(SPSCQueue<int,_std::allocator<int>_> **)((long)local_328._M_id._M_thread + 0x10) = &local_1c0;
  *(SPSCQueue<int,_std::allocator<int>_> **)((long)local_328._M_id._M_thread + 0x18) = &local_300;
  std::thread::_M_start_thread(&local_320,&local_328,0);
  if (local_328._M_id._M_thread != 0) {
    (**(code **)(*(long *)local_328._M_id._M_thread + 8))();
  }
  pinThread(iVar2);
  local_310 = std::chrono::_V2::steady_clock::now();
  iVar2 = 0;
  while (local_328._M_id._M_thread._0_4_ = iVar2, iVar2 < 10000000) {
    do {
      bVar1 = boost::lockfree::detail::runtime_sized_ringbuffer<int,_std::allocator<int>_>::push
                        ((runtime_sized_ringbuffer<int,_std::allocator<int>_> *)&local_1c0,
                         (int *)&local_328);
    } while (!bVar1);
    do {
      sVar6 = boost::lockfree::detail::runtime_sized_ringbuffer<int,_std::allocator<int>_>::pop
                        ((runtime_sized_ringbuffer<int,_std::allocator<int>_> *)&local_300,
                         &local_304,1);
    } while (sVar6 != 1);
    iVar2 = (int)local_328._M_id._M_thread + 1;
  }
  std::chrono::_V2::steady_clock::now();
  std::thread::join();
  poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
  poVar4 = std::operator<<(poVar4," ns RTT");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::thread::~thread(&local_320);
  boost::lockfree::detail::runtime_sized_ringbuffer<int,_std::allocator<int>_>::
  ~runtime_sized_ringbuffer((runtime_sized_ringbuffer<int,_std::allocator<int>_> *)&local_300);
  boost::lockfree::detail::runtime_sized_ringbuffer<int,_std::allocator<int>_>::
  ~runtime_sized_ringbuffer((runtime_sized_ringbuffer<int,_std::allocator<int>_> *)&local_1c0);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  (void)argc, (void)argv;

  using namespace rigtorp;

  int cpu1 = -1;
  int cpu2 = -1;

  if (argc == 3) {
    cpu1 = std::stoi(argv[1]);
    cpu2 = std::stoi(argv[2]);
  }

  const size_t queueSize = 10000000;
  const int64_t iters = 10000000;

  std::cout << "SPSCQueue:" << std::endl;

  {
    SPSCQueue<int> q(queueSize);
    auto t = std::thread([&] {
      pinThread(cpu1);
      for (int i = 0; i < iters; ++i) {
        while (!q.front())
          ;
        if (*q.front() != i) {
          throw std::runtime_error("");
        }
        q.pop();
      }
    });

    pinThread(cpu2);

    auto start = std::chrono::steady_clock::now();
    for (int i = 0; i < iters; ++i) {
      q.emplace(i);
    }
    t.join();
    auto stop = std::chrono::steady_clock::now();
    std::cout << iters * 1000000 /
                     std::chrono::duration_cast<std::chrono::nanoseconds>(stop -
                                                                          start)
                         .count()
              << " ops/ms" << std::endl;
  }

  {
    SPSCQueue<int> q1(queueSize), q2(queueSize);
    auto t = std::thread([&] {
      pinThread(cpu1);
      for (int i = 0; i < iters; ++i) {
        while (!q1.front())
          ;
        q2.emplace(*q1.front());
        q1.pop();
      }
    });

    pinThread(cpu2);

    auto start = std::chrono::steady_clock::now();
    for (int i = 0; i < iters; ++i) {
      q1.emplace(i);
      while (!q2.front())
        ;
      q2.pop();
    }
    auto stop = std::chrono::steady_clock::now();
    t.join();
    std::cout << std::chrono::duration_cast<std::chrono::nanoseconds>(stop -
                                                                      start)
                         .count() /
                     iters
              << " ns RTT" << std::endl;
  }

#if __has_include(<boost/lockfree/spsc_queue.hpp> )
  std::cout << "boost::lockfree::spsc:" << std::endl;
  {
    boost::lockfree::spsc_queue<int> q(queueSize);
    auto t = std::thread([&] {
      pinThread(cpu1);
      for (int i = 0; i < iters; ++i) {
        int val;
        while (q.pop(&val, 1) != 1)
          ;
        if (val != i) {
          throw std::runtime_error("");
        }
      }
    });

    pinThread(cpu2);

    auto start = std::chrono::steady_clock::now();
    for (int i = 0; i < iters; ++i) {
      while (!q.push(i))
        ;
    }
    t.join();
    auto stop = std::chrono::steady_clock::now();
    std::cout << iters * 1000000 /
                     std::chrono::duration_cast<std::chrono::nanoseconds>(stop -
                                                                          start)
                         .count()
              << " ops/ms" << std::endl;
  }

  {
    boost::lockfree::spsc_queue<int> q1(queueSize), q2(queueSize);
    auto t = std::thread([&] {
      pinThread(cpu1);
      for (int i = 0; i < iters; ++i) {
        int val;
        while (q1.pop(&val, 1) != 1)
          ;
        while (!q2.push(val))
          ;
      }
    });

    pinThread(cpu2);

    auto start = std::chrono::steady_clock::now();
    for (int i = 0; i < iters; ++i) {
      while (!q1.push(i))
        ;
      int val;
      while (q2.pop(&val, 1) != 1)
        ;
    }
    auto stop = std::chrono::steady_clock::now();
    t.join();
    std::cout << std::chrono::duration_cast<std::chrono::nanoseconds>(stop -
                                                                      start)
                         .count() /
                     iters
              << " ns RTT" << std::endl;
  }
#endif

#if __has_include(<folly/ProducerConsumerQueue.h>)
  std::cout << "folly::ProducerConsumerQueue:" << std::endl;

  {
    folly::ProducerConsumerQueue<int> q(queueSize);
    auto t = std::thread([&] {
      pinThread(cpu1);
      for (int i = 0; i < iters; ++i) {
        int val;
        while (!q.read(val))
          ;
        if (val != i) {
          throw std::runtime_error("");
        }
      }
    });

    pinThread(cpu2);

    auto start = std::chrono::steady_clock::now();
    for (int i = 0; i < iters; ++i) {
      while (!q.write(i))
        ;
    }
    t.join();
    auto stop = std::chrono::steady_clock::now();
    std::cout << iters * 1000000 /
                     std::chrono::duration_cast<std::chrono::nanoseconds>(stop -
                                                                          start)
                         .count()
              << " ops/ms" << std::endl;
  }

  {
    folly::ProducerConsumerQueue<int> q1(queueSize), q2(queueSize);
    auto t = std::thread([&] {
      pinThread(cpu1);
      for (int i = 0; i < iters; ++i) {
        int val;
        while (!q1.read(val))
          ;
        q2.write(val);
      }
    });

    pinThread(cpu2);

    auto start = std::chrono::steady_clock::now();
    for (int i = 0; i < iters; ++i) {
      while (!q1.write(i))
        ;
      int val;
      while (!q2.read(val))
        ;
    }
    auto stop = std::chrono::steady_clock::now();
    t.join();
    std::cout << std::chrono::duration_cast<std::chrono::nanoseconds>(stop -
                                                                      start)
                         .count() /
                     iters
              << " ns RTT" << std::endl;
  }
#endif

  return 0;
}